

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

wchar_t * archive_acl_text_w(archive *a,archive_acl *acl,wchar_t flags)

{
  archive_acl *paVar1;
  wchar_t wVar2;
  size_t sVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  archive_acl_entry *paVar8;
  int iVar9;
  wchar_t *wp;
  wchar_t *wname;
  wchar_t *local_48;
  wchar_t *local_40;
  archive_acl *local_38;
  
  if (acl->acl_text_w != (wchar_t *)0x0) {
    free(acl->acl_text_w);
    acl->acl_text_w = (wchar_t *)0x0;
  }
  paVar8 = acl->acl_head;
  if (paVar8 != (archive_acl_entry *)0x0) {
    lVar7 = 0;
    iVar9 = 0;
    local_38 = acl;
    do {
      if ((paVar8->type & flags) != 0) {
        lVar6 = lVar7 + 8;
        if (((uint)paVar8->type >> 9 & 1) == 0) {
          lVar6 = lVar7;
        }
        if (((uint)flags >> 0xb & 1) == 0) {
          lVar6 = lVar7;
        }
        wVar2 = archive_mstring_get_wcs(a,&paVar8->name,&local_40);
        if (local_40 == (wchar_t *)0x0 || wVar2 != L'\0') {
          if ((wVar2 < L'\0') && (piVar4 = __errno_location(), *piVar4 == 0xc)) {
            return (wchar_t *)0x0;
          }
          lVar7 = lVar6 + 0x13;
        }
        else {
          sVar3 = wcslen(local_40);
          lVar7 = lVar6 + sVar3 + 6;
        }
        iVar9 = iVar9 + 1;
        lVar7 = lVar7 + 0x13;
      }
      paVar8 = paVar8->next;
    } while (paVar8 != (archive_acl_entry *)0x0);
    if (iVar9 != 0) {
      sVar3 = lVar7 * 4 + 0x80;
      if (iVar9 < 1) {
        sVar3 = lVar7 * 4;
      }
      if (((uint)flags >> 8 & 1) == 0) {
        sVar3 = lVar7 * 4;
      }
      local_48 = (wchar_t *)malloc(sVar3);
      paVar1 = local_38;
      local_38->acl_text_w = local_48;
      if (local_48 != (wchar_t *)0x0) {
        if (((uint)flags >> 8 & 1) != 0) {
          append_entry_w(&local_48,(wchar_t *)0x0,L'✒',(wchar_t *)0x0,local_38->mode & 0x1c0,
                         L'\xffffffff');
          *local_48 = L',';
          local_48 = local_48 + 1;
          append_entry_w(&local_48,(wchar_t *)0x0,L'✔',(wchar_t *)0x0,paVar1->mode & 0x38,
                         L'\xffffffff');
          *local_48 = L',';
          local_48 = local_48 + 1;
          append_entry_w(&local_48,(wchar_t *)0x0,L'✖',(wchar_t *)0x0,paVar1->mode & 7,
                         L'\xffffffff');
          paVar8 = paVar1->acl_head;
          if (paVar8 != (archive_acl_entry *)0x0) {
            do {
              if ((paVar8->type & L'Ā') != L'\0') {
                wVar2 = archive_mstring_get_wcs(a,&paVar8->name,&local_40);
                if (wVar2 == L'\0') {
                  *local_48 = L',';
                  wVar2 = L'\xffffffff';
                  if (((uint)flags >> 10 & 1) != 0) {
                    wVar2 = paVar8->id;
                  }
                  local_48 = local_48 + 1;
                  append_entry_w(&local_48,(wchar_t *)0x0,paVar8->tag,local_40,paVar8->permset,wVar2
                                );
                }
                else if ((wVar2 < L'\0') && (piVar4 = __errno_location(), *piVar4 == 0xc)) {
                  return (wchar_t *)0x0;
                }
              }
              paVar8 = paVar8->next;
            } while (paVar8 != (archive_acl_entry *)0x0);
          }
        }
        if (((uint)flags >> 9 & 1) != 0) {
          piVar4 = (wchar_t *)0x0;
          if (((uint)flags >> 0xb & 1) != 0) {
            piVar4 = anon_var_dwarf_13b15c;
          }
          paVar8 = local_38->acl_head;
          if (paVar8 != (archive_acl_entry *)0x0) {
            iVar9 = 0;
            do {
              if ((paVar8->type & L'Ȁ') != L'\0') {
                wVar2 = archive_mstring_get_wcs(a,&paVar8->name,&local_40);
                if (wVar2 == L'\0') {
                  if (0 < iVar9) {
                    *local_48 = L',';
                    local_48 = local_48 + 1;
                  }
                  wVar2 = L'\xffffffff';
                  if (((uint)flags >> 10 & 1) != 0) {
                    wVar2 = paVar8->id;
                  }
                  append_entry_w(&local_48,piVar4,paVar8->tag,local_40,paVar8->permset,wVar2);
                  iVar9 = iVar9 + 1;
                }
                else if ((wVar2 < L'\0') && (piVar5 = __errno_location(), *piVar5 == 0xc)) {
                  return (wchar_t *)0x0;
                }
              }
              paVar8 = paVar8->next;
            } while (paVar8 != (archive_acl_entry *)0x0);
          }
        }
        return local_38->acl_text_w;
      }
    }
  }
  return (wchar_t *)0x0;
}

Assistant:

const wchar_t *
archive_acl_text_w(struct archive *a, struct archive_acl *acl, int flags)
{
	int count;
	size_t length;
	const wchar_t *wname;
	const wchar_t *prefix;
	wchar_t separator;
	struct archive_acl_entry *ap;
	int id, r;
	wchar_t *wp;

	if (acl->acl_text_w != NULL) {
		free (acl->acl_text_w);
		acl->acl_text_w = NULL;
	}

	separator = L',';
	count = 0;
	length = 0;
	ap = acl->acl_head;
	while (ap != NULL) {
		if ((ap->type & flags) != 0) {
			count++;
			if ((flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) &&
			    (ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT))
				length += 8; /* "default:" */
			length += 5; /* tag name */
			length += 1; /* colon */
			r = archive_mstring_get_wcs(a, &ap->name, &wname);
			if (r == 0 && wname != NULL)
				length += wcslen(wname);
			else if (r < 0 && errno == ENOMEM)
				return (NULL);
			else
				length += sizeof(uid_t) * 3 + 1;
			length ++; /* colon */
			length += 3; /* rwx */
			length += 1; /* colon */
			length += max(sizeof(uid_t), sizeof(gid_t)) * 3 + 1;
			length ++; /* newline */
		}
		ap = ap->next;
	}

	if (count > 0 && ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0)) {
		length += 10; /* "user::rwx\n" */
		length += 11; /* "group::rwx\n" */
		length += 11; /* "other::rwx\n" */
	}

	if (count == 0)
		return (NULL);

	/* Now, allocate the string and actually populate it. */
	wp = acl->acl_text_w = (wchar_t *)malloc(length * sizeof(wchar_t));
	if (wp == NULL)
		return (NULL);
	count = 0;
	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_USER_OBJ, NULL,
		    acl->mode & 0700, -1);
		*wp++ = ',';
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_GROUP_OBJ, NULL,
		    acl->mode & 0070, -1);
		*wp++ = ',';
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_OTHER, NULL,
		    acl->mode & 0007, -1);
		count += 3;

		ap = acl->acl_head;
		while (ap != NULL) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
				r = archive_mstring_get_wcs(a, &ap->name, &wname);
				if (r == 0) {
					*wp++ = separator;
					if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
						id = ap->id;
					else
						id = -1;
					append_entry_w(&wp, NULL, ap->tag, wname,
					    ap->permset, id);
					count++;
				} else if (r < 0 && errno == ENOMEM)
					return (NULL);
			}
			ap = ap->next;
		}
	}


	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0) {
		if (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT)
			prefix = L"default:";
		else
			prefix = NULL;
		ap = acl->acl_head;
		count = 0;
		while (ap != NULL) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0) {
				r = archive_mstring_get_wcs(a, &ap->name, &wname);
				if (r == 0) {
					if (count > 0)
						*wp++ = separator;
					if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
						id = ap->id;
					else
						id = -1;
					append_entry_w(&wp, prefix, ap->tag,
					    wname, ap->permset, id);
					count ++;
				} else if (r < 0 && errno == ENOMEM)
					return (NULL);
			}
			ap = ap->next;
		}
	}

	return (acl->acl_text_w);
}